

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall cmCTest::AddSiteProperties(cmCTest *this,cmXMLWriter *xml)

{
  cmCTestScriptHandler *pcVar1;
  bool bVar2;
  cmState *pcVar3;
  char *pcVar4;
  cmake *this_00;
  reference value;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  char *local_168;
  char *label;
  string local_158;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 local_108 [8];
  string l;
  string local_e0;
  allocator local_b9;
  string local_b8;
  char *local_98;
  char *labels;
  string local_88;
  allocator local_51;
  string local_50;
  char *local_30;
  char *subproject;
  cmake *cm;
  cmCTestScriptHandler *ch;
  cmXMLWriter *xml_local;
  cmCTest *this_local;
  
  ch = (cmCTestScriptHandler *)xml;
  xml_local = (cmXMLWriter *)this;
  cm = (cmake *)GetHandler(this,"script");
  subproject = (char *)cmCTestScriptHandler::GetCMake((cmCTestScriptHandler *)cm);
  if ((cmake *)subproject != (cmake *)0x0) {
    pcVar3 = cmake::GetState((cmake *)subproject);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"SubProject",&local_51);
    pcVar4 = cmState::GetGlobalProperty(pcVar3,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    pcVar1 = ch;
    local_30 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_88,"Subproject",(allocator *)((long)&labels + 7));
      cmXMLWriter::StartElement((cmXMLWriter *)pcVar1,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)((long)&labels + 7));
      cmXMLWriter::Attribute<char_const*>((cmXMLWriter *)ch,"name",&local_30);
      this_00 = cmCTestScriptHandler::GetCMake((cmCTestScriptHandler *)cm);
      pcVar3 = cmake::GetState(this_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b8,"SubProjectLabels",&local_b9);
      pcVar4 = cmState::GetGlobalProperty(pcVar3,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      pcVar1 = ch;
      local_98 = pcVar4;
      if (pcVar4 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_e0,"Labels",(allocator *)(l.field_2._M_local_buf + 0xf));
        cmXMLWriter::StartElement((cmXMLWriter *)pcVar1,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator((allocator<char> *)(l.field_2._M_local_buf + 0xf));
        pcVar4 = local_98;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_108,pcVar4,
                   (allocator *)
                   ((long)&args.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&args.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
        cmSystemTools::ExpandListArgument
                  ((string *)local_108,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&i,false);
        local_130._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i);
        while( true ) {
          local_138._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i);
          bVar2 = __gnu_cxx::operator!=(&local_130,&local_138);
          pcVar1 = ch;
          if (!bVar2) break;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_158,"Label",(allocator *)((long)&label + 7))
          ;
          value = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_130);
          cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)pcVar1,&local_158,value);
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator((allocator<char> *)((long)&label + 7));
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_130);
        }
        cmXMLWriter::EndElement((cmXMLWriter *)ch);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i);
        std::__cxx11::string::~string((string *)local_108);
      }
      cmXMLWriter::EndElement((cmXMLWriter *)ch);
    }
    pcVar3 = cmake::GetState((cmake *)subproject);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_188,"Label",&local_189);
    pcVar4 = cmState::GetGlobalProperty(pcVar3,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    pcVar1 = ch;
    if (pcVar4 != (char *)0x0) {
      local_168 = pcVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1b0,"Labels",&local_1b1);
      cmXMLWriter::StartElement((cmXMLWriter *)pcVar1,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      pcVar1 = ch;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1d8,"Label",&local_1d9);
      cmXMLWriter::Element<char_const*>((cmXMLWriter *)pcVar1,&local_1d8,&local_168);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      cmXMLWriter::EndElement((cmXMLWriter *)ch);
    }
  }
  return;
}

Assistant:

void cmCTest::AddSiteProperties(cmXMLWriter& xml)
{
  cmCTestScriptHandler* ch =
    static_cast<cmCTestScriptHandler*>(this->GetHandler("script"));
  cmake* cm =  ch->GetCMake();
  // if no CMake then this is the old style script and props like
  // this will not work anyway.
  if(!cm)
    {
    return;
    }
  // This code should go when cdash is changed to use labels only
  const char* subproject = cm->GetState()
                             ->GetGlobalProperty("SubProject");
  if(subproject)
    {
    xml.StartElement("Subproject");
    xml.Attribute("name", subproject);
    const char* labels =
      ch->GetCMake()->GetState()
                    ->GetGlobalProperty("SubProjectLabels");
    if(labels)
      {
      xml.StartElement("Labels");
      std::string l = labels;
      std::vector<std::string> args;
      cmSystemTools::ExpandListArgument(l, args);
      for(std::vector<std::string>::iterator i = args.begin();
          i != args.end(); ++i)
        {
        xml.Element("Label", *i);
        }
      xml.EndElement();
      }
    xml.EndElement();
    }

  // This code should stay when cdash only does label based sub-projects
  const char* label = cm->GetState()->GetGlobalProperty("Label");
  if(label)
    {
    xml.StartElement("Labels");
    xml.Element("Label", label);
    xml.EndElement();
    }
}